

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O2

void __thiscall
SuiteTimeRangeTests::TestisInSameRange_UseLocalTime::TestisInSameRange_UseLocalTime
          (TestisInSameRange_UseLocalTime *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"isInSameRange_UseLocalTime","TimeRangeTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/TimeRangeTestCase.cpp"
             ,0xfb);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00321390;
  return;
}

Assistant:

TEST(isInSameRange_UseLocalTime)
{
  LocalTimeOnly start( 0, 0, 0 );
  LocalTimeOnly end( 1, 0, 0 );

  UtcTimeStamp time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  UtcTimeStamp time2 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  TimeRange timeRange(start, end, 1, 1);

  CHECK( timeRange.isInSameRange(time1, time2) );

}